

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::leF64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *other_local;
  Literal *this_local;
  
  compare<2,_&wasm::Literal::getLanesF64x2,_&wasm::Literal::le,_long>
            (__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::leF64x2(const Literal& other) const {
  return compare<2, &Literal::getLanesF64x2, &Literal::le, int64_t>(*this,
                                                                    other);
}